

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int yaml_parser_parse_document_start(yaml_parser_t *parser,yaml_event_t *event,int implicit)

{
  yaml_parser_state_t *pyVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  yaml_token_t *pyVar5;
  yaml_version_directive_t *version_directive;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_tag_directive_t *local_88;
  yaml_tag_directive_t *apyStack_80 [2];
  yaml_version_directive_t *local_70;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  size_t local_48;
  size_t sStack_40;
  size_t local_38;
  
  local_70 = (yaml_version_directive_t *)0x0;
  local_88 = (yaml_tag_directive_t *)0x0;
  apyStack_80[0] = (yaml_tag_directive_t *)0x0;
  if ((parser->token_available == 0) && (iVar4 = yaml_parser_fetch_more_tokens(parser), iVar4 == 0))
  {
    pyVar5 = (yaml_token_t *)0x0;
  }
  else {
    pyVar5 = (parser->tokens).head;
  }
  if (pyVar5 != (yaml_token_t *)0x0) {
    if (implicit != 0) {
LAB_001afb68:
      if ((implicit == 0) || (pyVar5->type - YAML_STREAM_END_TOKEN < 4)) {
        if (pyVar5->type != YAML_STREAM_END_TOKEN) {
          local_48 = (pyVar5->start_mark).index;
          sStack_40 = (pyVar5->start_mark).line;
          local_38 = (pyVar5->start_mark).column;
          iVar4 = yaml_parser_process_directives(parser,&local_70,&local_88,apyStack_80);
          if (iVar4 == 0) {
            pyVar5 = (yaml_token_t *)0x0;
            bVar3 = false;
          }
          else {
            if ((parser->token_available == 0) &&
               (iVar4 = yaml_parser_fetch_more_tokens(parser), iVar4 == 0)) {
              pyVar5 = (yaml_token_t *)0x0;
            }
            else {
              pyVar5 = (parser->tokens).head;
            }
            bVar3 = true;
            if (pyVar5 != (yaml_token_t *)0x0) {
              if (pyVar5->type == YAML_DOCUMENT_START_TOKEN) {
                if (((parser->states).top == (parser->states).end) &&
                   (iVar4 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                              &(parser->states).end), iVar4 == 0)) {
                  parser->error = YAML_MEMORY_ERROR;
                }
                else {
                  pyVar1 = (parser->states).top;
                  (parser->states).top = pyVar1 + 1;
                  *pyVar1 = YAML_PARSE_DOCUMENT_END_STATE;
                  parser->state = YAML_PARSE_DOCUMENT_CONTENT_STATE;
                  local_58 = (pyVar5->end_mark).column;
                  local_68 = (pyVar5->end_mark).index;
                  sStack_60 = (pyVar5->end_mark).line;
                  *(undefined8 *)event = 0;
                  (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
                  bVar3 = false;
                  (event->end_mark).column = 0;
                  (event->end_mark).index = 0;
                  (event->end_mark).line = 0;
                  (event->start_mark).line = 0;
                  (event->start_mark).column = 0;
                  *(undefined8 *)((long)&event->data + 0x28) = 0;
                  (event->start_mark).index = 0;
                  (event->data).scalar.length = 0;
                  *(undefined8 *)((long)&event->data + 0x20) = 0;
                  (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
                  (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
                  event->type = YAML_DOCUMENT_START_EVENT;
                  (event->start_mark).column = local_38;
                  (event->start_mark).index = local_48;
                  (event->start_mark).line = sStack_40;
                  (event->end_mark).index = local_68;
                  (event->end_mark).line = sStack_60;
                  (event->end_mark).column = local_58;
                  (event->data).document_start.version_directive = local_70;
                  (event->data).document_start.tag_directives.start = local_88;
                  (event->data).document_start.tag_directives.end = apyStack_80[0];
                  (event->data).document_start.implicit = 0;
                  parser->token_available = 0;
                  parser->tokens_parsed = parser->tokens_parsed + 1;
                  pyVar5 = (parser->tokens).head;
                  parser->stream_end_produced = (uint)(pyVar5->type == YAML_STREAM_END_TOKEN);
                  (parser->tokens).head = pyVar5 + 1;
                  local_70 = (yaml_version_directive_t *)0x0;
                  local_88 = (yaml_tag_directive_t *)0x0;
                  apyStack_80[0] = (yaml_tag_directive_t *)0x0;
                  pyVar5 = (yaml_token_t *)0x1;
                }
              }
              else {
                local_58 = (pyVar5->start_mark).column;
                local_68 = (pyVar5->start_mark).index;
                sStack_60 = (pyVar5->start_mark).line;
                parser->error = YAML_PARSER_ERROR;
                parser->problem = "did not find expected <document start>";
                (parser->problem_mark).index = local_68;
                (parser->problem_mark).line = sStack_60;
                (parser->problem_mark).column = local_58;
              }
            }
          }
          if (bVar3) {
            yaml_free(local_70);
            for (; local_88 != apyStack_80[0]; apyStack_80[0] = apyStack_80[0] + -1) {
              yaml_free(apyStack_80[0][-1].handle);
              yaml_free(apyStack_80[0][-1].prefix);
            }
            yaml_free(local_88);
            return 0;
          }
          return (int)pyVar5;
        }
        parser->state = YAML_PARSE_END_STATE;
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->end_mark).index = 0;
        (event->end_mark).line = 0;
        (event->start_mark).line = 0;
        (event->start_mark).column = 0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->start_mark).index = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        (event->end_mark).column = 0;
        event->type = YAML_STREAM_END_EVENT;
        (event->start_mark).column = (pyVar5->start_mark).column;
        sVar2 = (pyVar5->start_mark).line;
        (event->start_mark).index = (pyVar5->start_mark).index;
        (event->start_mark).line = sVar2;
        (event->end_mark).column = (pyVar5->end_mark).column;
        sVar2 = (pyVar5->end_mark).line;
        (event->end_mark).index = (pyVar5->end_mark).index;
        (event->end_mark).line = sVar2;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        pyVar5 = (parser->tokens).head;
        parser->stream_end_produced = (uint)(pyVar5->type == YAML_STREAM_END_TOKEN);
        (parser->tokens).head = pyVar5 + 1;
      }
      else {
        iVar4 = yaml_parser_process_directives
                          (parser,(yaml_version_directive_t **)0x0,(yaml_tag_directive_t **)0x0,
                           (yaml_tag_directive_t **)0x0);
        if (iVar4 == 0) {
          return 0;
        }
        if (((parser->states).top == (parser->states).end) &&
           (iVar4 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                      &(parser->states).end), iVar4 == 0)) {
          parser->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar1 = (parser->states).top;
        (parser->states).top = pyVar1 + 1;
        *pyVar1 = YAML_PARSE_DOCUMENT_END_STATE;
        parser->state = YAML_PARSE_BLOCK_NODE_STATE;
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->end_mark).column = 0;
        (event->end_mark).index = 0;
        (event->end_mark).line = 0;
        (event->start_mark).line = 0;
        (event->start_mark).column = 0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->start_mark).index = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        event->type = YAML_DOCUMENT_START_EVENT;
        sVar2 = (pyVar5->start_mark).line;
        (event->start_mark).index = (pyVar5->start_mark).index;
        (event->start_mark).line = sVar2;
        (event->start_mark).column = (pyVar5->start_mark).column;
        sVar2 = (pyVar5->start_mark).line;
        (event->end_mark).index = (pyVar5->start_mark).index;
        (event->end_mark).line = sVar2;
        (event->end_mark).column = (pyVar5->start_mark).column;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.implicit = 1;
      }
      return 1;
    }
    do {
      if (pyVar5->type != YAML_DOCUMENT_END_TOKEN) goto LAB_001afb68;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar5 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar5->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar5 + 1;
      iVar4 = yaml_parser_fetch_more_tokens(parser);
      if (iVar4 == 0) {
        pyVar5 = (yaml_token_t *)0x0;
      }
      else {
        pyVar5 = (parser->tokens).head;
      }
    } while (pyVar5 != (yaml_token_t *)0x0);
  }
  return 0;
}

Assistant:

static int
yaml_parser_parse_document_start(yaml_parser_t *parser, yaml_event_t *event,
        int implicit)
{
    yaml_token_t *token;
    yaml_version_directive_t *version_directive = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
    } tag_directives = { NULL, NULL };

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    /* Parse extra document end indicators. */

    if (!implicit)
    {
        while (token->type == YAML_DOCUMENT_END_TOKEN) {
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) return 0;
        }
    }

    /* Parse an implicit document. */

    if (implicit && token->type != YAML_VERSION_DIRECTIVE_TOKEN &&
            token->type != YAML_TAG_DIRECTIVE_TOKEN &&
            token->type != YAML_DOCUMENT_START_TOKEN &&
            token->type != YAML_STREAM_END_TOKEN)
    {
        if (!yaml_parser_process_directives(parser, NULL, NULL, NULL))
            return 0;
        if (!PUSH(parser, parser->states, YAML_PARSE_DOCUMENT_END_STATE))
            return 0;
        parser->state = YAML_PARSE_BLOCK_NODE_STATE;
        DOCUMENT_START_EVENT_INIT(*event, NULL, NULL, NULL, 1,
                token->start_mark, token->start_mark);
        return 1;
    }

    /* Parse an explicit document. */

    else if (token->type != YAML_STREAM_END_TOKEN)
    {
        yaml_mark_t start_mark, end_mark;
        start_mark = token->start_mark;
        if (!yaml_parser_process_directives(parser, &version_directive,
                    &tag_directives.start, &tag_directives.end))
            return 0;
        token = PEEK_TOKEN(parser);
        if (!token) goto error;
        if (token->type != YAML_DOCUMENT_START_TOKEN) {
            yaml_parser_set_parser_error(parser,
                    "did not find expected <document start>", token->start_mark);
            goto error;
        }
        if (!PUSH(parser, parser->states, YAML_PARSE_DOCUMENT_END_STATE))
            goto error;
        parser->state = YAML_PARSE_DOCUMENT_CONTENT_STATE;
        end_mark = token->end_mark;
        DOCUMENT_START_EVENT_INIT(*event, version_directive,
                tag_directives.start, tag_directives.end, 0,
                start_mark, end_mark);
        SKIP_TOKEN(parser);
        version_directive = NULL;
        tag_directives.start = tag_directives.end = NULL;
        return 1;
    }

    /* Parse the stream end. */

    else
    {
        parser->state = YAML_PARSE_END_STATE;
        STREAM_END_EVENT_INIT(*event, token->start_mark, token->end_mark);
        SKIP_TOKEN(parser);
        return 1;
    }

error:
    yaml_free(version_directive);
    while (tag_directives.start != tag_directives.end) {
        yaml_free(tag_directives.end[-1].handle);
        yaml_free(tag_directives.end[-1].prefix);
        tag_directives.end --;
    }
    yaml_free(tag_directives.start);
    return 0;
}